

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O1

void __thiscall miniros::network::NetAddress::NetAddress(NetAddress *this,NetAddress *other)

{
  this->type = AddressInvalid;
  (this->address)._M_dataplus._M_p = (pointer)&(this->address).field_2;
  (this->address)._M_string_length = 0;
  (this->address).field_2._M_local_buf[0] = '\0';
  this->port = 0;
  this->rawAddress = (void *)0x0;
  this->rawAddress = other->rawAddress;
  other->rawAddress = (void *)0x0;
  std::__cxx11::string::swap((string *)&this->address);
  this->port = other->port;
  this->type = other->type;
  return;
}

Assistant:

NetAddress::NetAddress(NetAddress&& other) noexcept
{
  std::swap(rawAddress, other.rawAddress);
  std::swap(address, other.address);

  port = other.port;
  type = other.type;
}